

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

size_t jessilib::array_start_action<char8_t,jessilib::json_context<char8_t,true>>
                 (json_context<char8_t,_true> *inout_context,
                 basic_string_view<char8_t,_std::char_traits<char8_t>_> *inout_read_view)

{
  bool bVar1;
  const_reference pvVar2;
  invalid_argument *piVar3;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_RCX;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_c0;
  string local_b0;
  char local_89;
  undefined1 local_88 [7];
  char8_t front;
  object obj;
  undefined1 local_38 [8];
  vector<jessilib::object,_std::allocator<jessilib::object>_> result;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *inout_read_view_local;
  json_context<char8_t,_true> *inout_context_local;
  
  result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)inout_read_view;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_38);
  advance_whitespace<char8_t>
            ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
             result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                     result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,
               "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
              );
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::front
                     ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                      result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (*pvVar2 == ']') {
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
               result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,1);
    object::operator=<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
              (inout_context->out_object,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_38);
    inout_context_local = (json_context<char8_t,_true> *)0x1;
    obj.m_value.
    super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    .
    super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    ._56_4_ = 1;
LAB_002acba4:
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_38);
    return (size_t)inout_context_local;
  }
  while( true ) {
    object::object((object *)local_88);
    bVar1 = deserialize_json<char8_t,_true,_&jessilib::fail_action>
                      ((object *)local_88,
                       (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                       result.
                       super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::push_back
                ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_38,
                 (value_type *)local_88);
      advance_whitespace<char8_t>
                ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                 result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                        ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                         result.
                         super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._56_4_ = 2;
      }
      else {
        pvVar2 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::front
                           ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                            result.
                            super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_89 = *pvVar2;
        if (local_89 == ',') {
          std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                     result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,1);
          advance_whitespace<char8_t>
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                     result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          obj.m_value.
          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
          .
          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          ._56_4_ = 0;
        }
        else {
          if (local_89 != ']') {
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            local_c0 = sv("Invalid JSON data: expected \',\' or \']\', instead encountered: ",0x3d);
            join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>&>
                      (&local_b0,(jessilib *)&local_c0,
                       (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                       result.
                       super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,in_RCX);
            std::invalid_argument::invalid_argument(piVar3,(string *)&local_b0);
            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                     result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,1);
          object::
          operator=<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
                    (inout_context->out_object,
                     (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_38);
          inout_context_local = (json_context<char8_t,_true> *)0x1;
          obj.m_value.
          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
          .
          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          .
          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          ._56_4_ = 1;
        }
      }
    }
    else {
      obj.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._56_4_ = 2;
    }
    object::~object((object *)local_88);
    if (obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._56_4_ != 0) break;
    bVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                      ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                       result.
                       super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002acb3e:
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,
                 "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
                );
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  if (obj.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._56_4_ != 2) goto LAB_002acba4;
  goto LAB_002acb3e;
}

Assistant:

size_t array_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	std::vector<object> result;

	advance_whitespace(inout_read_view);
	if (inout_read_view.empty()) {
		if constexpr (ContextT::use_exceptions) {
			throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
		}

		return std::numeric_limits<size_t>::max();
	}

	// Checking here instead of top of loop means no trailing comma support.
	if (inout_read_view.front() == ']') {
		// End of array; success
		inout_read_view.remove_prefix(1);
		inout_context.out_object = std::move(result);
		return 1;
	}

	do {
		// Read object
		object obj;
		if (!deserialize_json<CharT, ContextT::use_exceptions>(obj, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}
		result.push_back(std::move(obj));

		advance_whitespace(inout_read_view);
		if (inout_read_view.empty()) {
			// Unexpected end of data; missing ']'; fail
			break;
		}

		CharT front = inout_read_view.front();
		if (front == ',') {
			// Strip comma
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);

			// Right now there's no trailing comma support; should behavior be a template option?
		}
		else if (front == ']') {
			// End of array; success
			inout_read_view.remove_prefix(1);
			inout_context.out_object = std::move(result);
			return 1;
		}
		else {
			// Invalid JSON!
			if constexpr (ContextT::use_exceptions) {
				using namespace std::literals;
				throw std::invalid_argument{ jessilib::join_mbstring(
					u8"Invalid JSON data: expected ',' or ']', instead encountered: "sv,
					inout_read_view) };
			}

			return std::numeric_limits<size_t>::max();
		}
	} while (!inout_read_view.empty());

	// Invalid JSON encountered
	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
	}

	return std::numeric_limits<size_t>::max();
}